

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass2_strategy.c
# Opt level: O3

void analyze_region(FIRSTPASS_STATS *stats,int k,REGIONS *regions)

{
  double dVar1;
  int iVar2;
  int iVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long lVar7;
  int iVar8;
  FIRSTPASS_STATS *pFVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  double num_frames;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dVar19;
  
  dVar11 = 0.0;
  dVar12 = 0.0;
  regions[k].avg_intra_err = 0.0;
  (&regions[k].avg_intra_err)[1] = 0.0;
  regions[k].avg_cor_coeff = 0.0;
  (&regions[k].avg_cor_coeff)[1] = 0.0;
  auVar6 = _DAT_004fc880;
  iVar2 = regions[k].start;
  lVar7 = (long)iVar2;
  iVar3 = regions[k].last;
  if (iVar2 <= iVar3) {
    iVar8 = (iVar3 - iVar2) + 1;
    dVar15 = (double)iVar8;
    dVar13 = regions[k].avg_noise_var;
    dVar14 = 0.0;
    pFVar9 = stats + lVar7;
    dVar16 = 0.0;
    lVar10 = lVar7;
    do {
      if ((k == 0) && (lVar10 <= lVar7)) {
        dVar1 = pFVar9->coded_error;
      }
      else {
        dVar1 = pFVar9->coded_error;
        dVar19 = dVar1;
        if (dVar1 <= pFVar9[-1].coded_error) {
          dVar19 = pFVar9[-1].coded_error;
        }
        if (dVar19 <= 0.001) {
          dVar19 = 0.001;
        }
        dVar16 = dVar16 + (pFVar9->sr_coded_error / dVar19) /
                          (double)(int)(iVar3 - (iVar2 + -1 + (uint)(k == 0)));
        regions[k].avg_sr_fr_ratio = dVar16;
      }
      auVar17._8_8_ = dVar1;
      auVar17._0_8_ = pFVar9->intra_error;
      auVar4._8_8_ = dVar15;
      auVar4._0_8_ = dVar15;
      auVar18 = divpd(auVar17,auVar4);
      dVar11 = dVar11 + auVar18._0_8_;
      dVar12 = dVar12 + auVar18._8_8_;
      auVar18._0_8_ = pFVar9->noise_var;
      auVar18._8_8_ = pFVar9->cor_coeff;
      auVar18 = maxpd(auVar18,auVar6);
      auVar5._8_8_ = dVar15;
      auVar5._0_8_ = dVar15;
      auVar18 = divpd(auVar18,auVar5);
      dVar13 = dVar13 + auVar18._0_8_;
      dVar14 = dVar14 + auVar18._8_8_;
      lVar10 = lVar10 + 1;
      pFVar9 = pFVar9 + 1;
      iVar8 = iVar8 + -1;
    } while (iVar8 != 0);
    regions[k].avg_intra_err = dVar11;
    regions[k].avg_coded_err = dVar12;
    regions[k].avg_noise_var = dVar13;
    regions[k].avg_cor_coeff = dVar14;
  }
  return;
}

Assistant:

static void analyze_region(const FIRSTPASS_STATS *stats, int k,
                           REGIONS *regions) {
  int i;
  regions[k].avg_cor_coeff = 0;
  regions[k].avg_sr_fr_ratio = 0;
  regions[k].avg_intra_err = 0;
  regions[k].avg_coded_err = 0;

  int check_first_sr = (k != 0);

  for (i = regions[k].start; i <= regions[k].last; i++) {
    if (i > regions[k].start || check_first_sr) {
      double num_frames =
          (double)(regions[k].last - regions[k].start + check_first_sr);
      double max_coded_error =
          AOMMAX(stats[i].coded_error, stats[i - 1].coded_error);
      double this_ratio =
          stats[i].sr_coded_error / AOMMAX(max_coded_error, 0.001);
      regions[k].avg_sr_fr_ratio += this_ratio / num_frames;
    }

    regions[k].avg_intra_err +=
        stats[i].intra_error / (double)(regions[k].last - regions[k].start + 1);
    regions[k].avg_coded_err +=
        stats[i].coded_error / (double)(regions[k].last - regions[k].start + 1);

    regions[k].avg_cor_coeff +=
        AOMMAX(stats[i].cor_coeff, 0.001) /
        (double)(regions[k].last - regions[k].start + 1);
    regions[k].avg_noise_var +=
        AOMMAX(stats[i].noise_var, 0.001) /
        (double)(regions[k].last - regions[k].start + 1);
  }
}